

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::BinaryAggregateHeap<int,_int,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<int,_int,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          int *key,int *value)

{
  int iVar1;
  STORAGE_TYPE *pSVar2;
  bool bVar3;
  STORAGE_TYPE SVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  HeapEntry<int> HVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  pSVar2 = this->heap;
  uVar7 = this->size;
  if (uVar7 < this->capacity) {
    pSVar2[uVar7].first.value = *key;
    pSVar2[uVar7].second.value = *value;
    this->size = uVar7 + 1;
    SVar4 = pSVar2[uVar7];
    uVar6 = uVar7;
    if (1 < (long)(uVar7 + 1)) {
      do {
        uVar5 = (long)((uVar7 - ((long)(uVar7 - 1) >> 0x3f)) + -1) >> 1;
        iVar1 = pSVar2[uVar5].first.value;
        uVar6 = uVar7;
        if (iVar1 <= SVar4.first.value.value) break;
        pSVar2[uVar7].first.value = iVar1;
        pSVar2[uVar7].second.value = pSVar2[uVar5].second.value;
        bVar3 = 2 < (long)uVar7;
        uVar6 = uVar5;
        uVar7 = uVar5;
      } while (bVar3);
    }
  }
  else {
    iVar1 = (pSVar2->first).value;
    if (*key <= iVar1) {
      return;
    }
    if (1 < (long)uVar7) {
      uVar6 = uVar7 * 8 - 8;
      SVar4 = pSVar2[uVar7 - 1];
      pSVar2[uVar7 - 1].first.value = iVar1;
      pSVar2[uVar7 - 1].second.value = (pSVar2->second).value;
      lVar10 = (long)uVar6 >> 3;
      if (lVar10 < 3) {
        lVar9 = 0;
      }
      else {
        lVar11 = 0;
        do {
          if (pSVar2[lVar11 * 2 + 1].first.value < pSVar2[lVar11 * 2 + 2].first.value) {
            lVar9 = lVar11 * 2 + 1;
          }
          else {
            lVar9 = lVar11 * 2 + 2;
          }
          pSVar2[lVar11] = pSVar2[lVar9];
          lVar11 = lVar9;
        } while (lVar9 < (lVar10 - (lVar10 + -1 >> 0x3f)) + -1 >> 1);
      }
      if (((uVar6 & 8) == 0) && (lVar9 == lVar10 + -2 >> 1)) {
        pSVar2[lVar9] = pSVar2[lVar9 * 2 + 1];
        lVar9 = lVar9 * 2 + 1;
      }
      HVar8 = SVar4.first.value;
      if (0 < lVar9) {
        do {
          lVar10 = (lVar9 - (lVar9 + -1 >> 0x3f)) + -1 >> 1;
          iVar1 = pSVar2[lVar10].first.value;
          if (iVar1 <= HVar8.value) break;
          pSVar2[lVar9].first.value = iVar1;
          pSVar2[lVar9].second.value = pSVar2[lVar10].second.value;
          bVar3 = 2 < lVar9;
          lVar9 = lVar10;
        } while (bVar3);
      }
      pSVar2[lVar9].first.value = HVar8.value;
      pSVar2[lVar9].second.value = SVar4.second.value.value;
    }
    pSVar2[uVar7 - 1].first.value = *key;
    pSVar2[uVar7 - 1].second.value = *value;
    SVar4 = pSVar2[uVar7 - 1];
    uVar6 = uVar7 - 1;
    if (1 < (long)uVar7) {
      do {
        uVar7 = (long)((uVar6 - ((long)(uVar6 - 1) >> 0x3f)) + -1) >> 1;
        iVar1 = pSVar2[uVar7].first.value;
        if (iVar1 <= SVar4.first.value.value) break;
        pSVar2[uVar6].first.value = iVar1;
        pSVar2[uVar6].second.value = pSVar2[uVar7].second.value;
        bVar3 = 2 < (long)uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
  }
  pSVar2[uVar6].first.value = SVar4.first.value.value;
  pSVar2[uVar6].second.value = SVar4.second.value.value;
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}